

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

timestamp_t
duckdb::DateTrunc::
UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MinuteOperator>
          (timestamp_t input)

{
  bool bVar1;
  dtime_t time_00;
  timestamp_t tVar2;
  undefined1 auVar3 [16];
  int32_t hour;
  date_t date;
  int32_t micros;
  int32_t sec;
  int32_t min;
  dtime_t time;
  timestamp_t local_58;
  date_t local_50;
  int32_t local_4c;
  int32_t local_48;
  int32_t local_44;
  string local_40;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar1) {
    Timestamp::Convert(input,&local_50,(dtime_t *)&local_40);
    Time::Convert((dtime_t)local_40._M_dataplus._M_p,(int32_t *)&local_58,&local_44,&local_48,
                  &local_4c);
    time_00 = Time::FromTime((int32_t)local_58.value,local_44,0,0);
    tVar2 = Timestamp::FromDatetime(local_50,time_00);
  }
  else {
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input,&local_58,false);
    if (!bVar1) {
      auVar3 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_40,(duckdb *)input.value,(timestamp_t)auVar3._8_8_);
      InvalidInputException::InvalidInputException(auVar3._0_8_,&local_40);
      __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    tVar2.value = CONCAT44(local_58.value._4_4_,(int32_t)local_58.value);
  }
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}